

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_begin(BEGIN_HANDLE begin)

{
  BEGIN_INSTANCE *begin_instance;
  AMQP_VALUE result;
  BEGIN_HANDLE begin_local;
  
  if (begin == (BEGIN_HANDLE)0x0) {
    begin_instance = (BEGIN_INSTANCE *)0x0;
  }
  else {
    begin_instance = (BEGIN_INSTANCE *)amqpvalue_clone(begin->composite_value);
  }
  return (AMQP_VALUE)begin_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_begin(BEGIN_HANDLE begin)
{
    AMQP_VALUE result;

    if (begin == NULL)
    {
        result = NULL;
    }
    else
    {
        BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)begin;
        result = amqpvalue_clone(begin_instance->composite_value);
    }

    return result;
}